

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

bool testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::NopAbsoluteXFixture>::
     IsValidParamName(string *name)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  ulong local_20;
  size_type index;
  string *name_local;
  
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (name);
  if (bVar1) {
    name_local._7_1_ = false;
  }
  else {
    for (local_20 = 0;
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(name), local_20 < sVar2; local_20 = local_20 + 1) {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[](name,local_20);
      bVar1 = IsAlNum(*pvVar3);
      if ((!bVar1) &&
         (pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   operator[](name,local_20), *pvVar3 != '_')) {
        return false;
      }
    }
    name_local._7_1_ = true;
  }
  return name_local._7_1_;
}

Assistant:

static bool IsValidParamName(const std::string& name) {
    // Check for empty string
    if (name.empty())
      return false;

    // Check for invalid characters
    for (std::string::size_type index = 0; index < name.size(); ++index) {
      if (!IsAlNum(name[index]) && name[index] != '_')
        return false;
    }

    return true;
  }